

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

void cfd::core::ParsePsbtOutput(Deserializer *parser,wally_psbt_output *output)

{
  bool bVar1;
  CfdException *pCVar2;
  allocator local_f1;
  string local_f0;
  CfdSourceLocation local_d0;
  undefined1 local_b2;
  allocator local_b1;
  string local_b0;
  CfdSourceLocation local_90;
  undefined1 local_78 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  undefined1 local_38 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> key;
  int ret;
  wally_psbt_output *output_local;
  Deserializer *parser_local;
  
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  do {
    Deserializer::ReadVariableBuffer(&local_50,parser);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,&local_50);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_50);
    bVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
    if (!bVar1) {
      Deserializer::ReadVariableBuffer
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78,parser);
      SetPsbtOutput((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78,output);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78);
    }
    bVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  } while (((bVar1 ^ 0xffU) & 1) != 0);
  key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = wally_map_sort(&output->keypaths,0);
  if (key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ != 0) {
    local_90.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_90.filename = local_90.filename + 1;
    local_90.line = 0x62b;
    local_90.funcname = "ParsePsbtOutput";
    logger::warn<int&>(&local_90,"wally_map_sort NG[{}]",
                       (int *)((long)&key.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    local_b2 = 1;
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_b0,"psbt output sort keypaths error.",&local_b1)
    ;
    CfdException::CfdException(pCVar2,kCfdInternalError,&local_b0);
    local_b2 = 0;
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = wally_map_sort(&output->unknowns,0);
  if (key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ != 0) {
    local_d0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_d0.filename = local_d0.filename + 1;
    local_d0.line = 0x631;
    local_d0.funcname = "ParsePsbtOutput";
    logger::warn<int&>(&local_d0,"wally_map_sort NG[{}]",
                       (int *)((long)&key.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_f0,"psbt output sort unknowns error.",&local_f1)
    ;
    CfdException::CfdException(pCVar2,kCfdInternalError,&local_f0);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  return;
}

Assistant:

static void ParsePsbtOutput(
    Deserializer *parser, struct wally_psbt_output *output) {
  int ret;
  std::vector<uint8_t> key;
  do {
    key = parser->ReadVariableBuffer();
    if (!key.empty()) {
      std::vector<uint8_t> buf = parser->ReadVariableBuffer();
      SetPsbtOutput(key, buf, output);
    }
  } while (!key.empty());

  ret = wally_map_sort(&output->keypaths, 0);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_map_sort NG[{}]", ret);
    throw CfdException(kCfdInternalError, "psbt output sort keypaths error.");
  }

  ret = wally_map_sort(&output->unknowns, 0);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_map_sort NG[{}]", ret);
    throw CfdException(kCfdInternalError, "psbt output sort unknowns error.");
  }
}